

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void __thiscall
CharConvUCS2B::pad(CharConvUCS2B *this,CVmDataSource *dst,char ch,long str_bytes,CVmPackType *t)

{
  int iVar1;
  
  iVar1 = CharConv::get_byte_count((CharConv *)this,t);
  CVmPack::write_padding(dst,'\0',ch,iVar1 - str_bytes);
  return;
}

Assistant:

virtual void pad(CVmDataSource *dst, char ch, long str_bytes,
                     const CVmPackType *t)
        { CVmPack::write_padding(dst, 0, ch, get_byte_count(t) - str_bytes); }